

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transpose.h
# Opt level: O2

void Eigen::internal::
     product_coeff_impl<2,_4,_Eigen::Transpose<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_double>
     ::run(Index row,Index col,Transpose<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *lhs,
          Matrix<double,_4,_4,_0,_4,_4> *rhs,double *res)

{
  Nested pMVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  
  pMVar1 = lhs->m_matrix + row;
  pdVar2 = (rhs->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
           array + col * 4;
  pdVar3 = lhs->m_matrix[row].super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
           .m_data.array + 2;
  pdVar4 = (rhs->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
           array + col * 4 + 2;
  *res = pdVar3[1] * pdVar4[1] +
         (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
         array[1] * pdVar2[1] +
         *pdVar3 * *pdVar4 +
         (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
         array[0] * *pdVar2;
  return;
}

Assistant:

const typename internal::remove_all<typename MatrixType::Nested>::type&
    nestedExpression() const { return m_matrix; }